

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

int Frc_ManPlaceDfsBoth(Frc_Man_t *p,Vec_Int_t *vCoOrder,int *piCutSize2)

{
  int iVar1;
  int nCutStart2;
  int nCutStart1;
  int *piCutSize2_local;
  Vec_Int_t *vCoOrder_local;
  Frc_Man_t *p_local;
  
  iVar1 = Frc_ManCrossCut(p,vCoOrder,0);
  Vec_IntReverseOrder(vCoOrder);
  p_local._4_4_ = Frc_ManCrossCut(p,vCoOrder,0);
  if (p_local._4_4_ < iVar1) {
    Frc_ManPlaceDfs(p,vCoOrder);
    Vec_IntReverseOrder(vCoOrder);
    *piCutSize2 = iVar1;
  }
  else {
    Vec_IntReverseOrder(vCoOrder);
    Frc_ManPlaceDfs(p,vCoOrder);
    *piCutSize2 = p_local._4_4_;
    p_local._4_4_ = iVar1;
  }
  return p_local._4_4_;
}

Assistant:

int Frc_ManPlaceDfsBoth( Frc_Man_t * p, Vec_Int_t * vCoOrder, int * piCutSize2 )
{
    int nCutStart1, nCutStart2;
    nCutStart1 = Frc_ManCrossCut( p, vCoOrder, 0 );
    Vec_IntReverseOrder( vCoOrder );
    nCutStart2 = Frc_ManCrossCut( p, vCoOrder, 0 );
    if ( nCutStart1 <= nCutStart2 )
    {
        Vec_IntReverseOrder( vCoOrder ); // undo
        Frc_ManPlaceDfs( p, vCoOrder );
        *piCutSize2 = nCutStart2;
        return nCutStart1;
    }
    else
    {
        Frc_ManPlaceDfs( p, vCoOrder );
        Vec_IntReverseOrder( vCoOrder ); // undo
        *piCutSize2 = nCutStart1;
        return nCutStart2;
    }
}